

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O2

void __thiscall
cbtGImpactMeshShapePart::TrimeshPrimitiveManager::get_bullet_triangle
          (TrimeshPrimitiveManager *this,int prim_index,cbtTriangleShapeEx *triangle)

{
  uint indices [3];
  uint local_24;
  uint local_20;
  uint local_1c;
  
  get_indices(this,prim_index,&local_24,&local_20,&local_1c);
  get_vertex(this,local_24,(triangle->super_cbtTriangleShape).m_vertices1);
  get_vertex(this,local_20,(triangle->super_cbtTriangleShape).m_vertices1 + 1);
  get_vertex(this,local_1c,(triangle->super_cbtTriangleShape).m_vertices1 + 2);
  (*(triangle->super_cbtTriangleShape).super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
    super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape[0xb])
            ((ulong)(uint)this->m_margin,triangle);
  return;
}

Assistant:

SIMD_FORCE_INLINE void get_bullet_triangle(int prim_index, cbtTriangleShapeEx& triangle) const
		{
			unsigned int indices[3];
			get_indices(prim_index, indices[0], indices[1], indices[2]);
			get_vertex(indices[0], triangle.m_vertices1[0]);
			get_vertex(indices[1], triangle.m_vertices1[1]);
			get_vertex(indices[2], triangle.m_vertices1[2]);
			triangle.setMargin(m_margin);
		}